

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall
lunasvg::Canvas::clipPath(Canvas *this,Path *path,FillRule clipRule,Transform *transform)

{
  undefined3 in_register_00000011;
  
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_transform(this->m_canvas,&transform->m_matrix);
  plutovg_canvas_set_fill_rule(this->m_canvas,CONCAT31(in_register_00000011,clipRule));
  plutovg_canvas_clip_path(this->m_canvas,path->m_data);
  return;
}

Assistant:

void Canvas::clipPath(const Path& path, FillRule clipRule, const Transform& transform)
{
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_set_fill_rule(m_canvas, static_cast<plutovg_fill_rule_t>(clipRule));
    plutovg_canvas_clip_path(m_canvas, path.data());
}